

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall Lowerer::LowerNewScObjArray(Lowerer *this,Instr *newObjInstr)

{
  TSize TVar1;
  Instr *this_00;
  code *pcVar2;
  Func *pFVar3;
  bool bVar4;
  ArgSlot AVar5;
  BailOutKind BVar6;
  uint length;
  uint uVar7;
  Instr *pIVar8;
  undefined4 *puVar9;
  RegOpnd *baseOpnd;
  ProfiledInstr *pPVar10;
  JITTimeProfileInfo *pJVar11;
  ArrayCallSiteInfo *pAVar12;
  LabelInstr *pLVar13;
  Opnd *pOVar14;
  Opnd *src2Opnd;
  ProfiledInstr *instr;
  SymOpnd *pSVar15;
  StackSym *pSVar16;
  RegOpnd *pRVar17;
  AddrOpnd *pAVar18;
  HelperCallOpnd *newSrc;
  IndirOpnd *pIVar19;
  Opnd *pOVar20;
  BranchInstr *branchInstr;
  IntConstOpnd *src;
  intptr_t iVar21;
  ProfileId index;
  Lowerer *pLVar22;
  Lowerer *pLVar23;
  Instr *local_88;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_7a;
  Lowerer *local_78;
  ArrayCallSiteInfo *local_70;
  LabelInstr *local_68;
  Func *local_60;
  intptr_t local_58;
  LabelInstr *local_50;
  Lowerer *local_48;
  LabelInstr *local_40;
  uint local_34;
  
  bVar4 = IR::Instr::HasEmptyArgOutChain(newObjInstr,(Instr **)0x0);
  if (bVar4) {
    IR::Instr::FreeSrc2(newObjInstr);
    pIVar8 = LowerNewScObjArrayNoArg(this,newObjInstr);
    return pIVar8;
  }
  local_60 = newObjInstr->m_func;
  pLVar23 = (Lowerer *)newObjInstr->m_src1;
  pLVar22 = pLVar23;
  bVar4 = IR::Opnd::IsAddrOpnd((Opnd *)pLVar23);
  if (bVar4) {
    local_88 = InsertLoweredRegionStartMarker(pLVar22,newObjInstr);
    instr = (ProfiledInstr *)newObjInstr;
  }
  else {
    if (((newObjInstr->field_0x38 & 0x10) == 0) ||
       (pLVar22 = (Lowerer *)newObjInstr, bVar4 = IR::Instr::OnlyHasLazyBailOut(newObjInstr), bVar4)
       ) {
      pIVar8 = LowerNewScObject(this,newObjInstr,true,true,false);
      return pIVar8;
    }
    local_88 = InsertLoweredRegionStartMarker(pLVar22,newObjInstr);
    BVar6 = IR::Instr::GetBailOutKind(newObjInstr);
    if ((BVar6 != BailOutOnNotNativeArray) &&
       (BVar6 = IR::Instr::GetBailOutKind(newObjInstr),
       BVar6 != (LazyBailOut|BailOutOnNotNativeArray))) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1462,
                         "(newObjInstr->GetBailOutKind() == IR::BailOutOnNotNativeArray || newObjInstr->GetBailOutKind() == BailOutInfo::WithLazyBailOut(IR::BailOutOnNotNativeArray))"
                         ,
                         "newObjInstr->GetBailOutKind() == IR::BailOutOnNotNativeArray || newObjInstr->GetBailOutKind() == BailOutInfo::WithLazyBailOut(IR::BailOutOnNotNativeArray)"
                        );
      if (!bVar4) goto LAB_005482df;
      *puVar9 = 0;
    }
    pFVar3 = local_60;
    pLVar13 = IR::LabelInstr::New(Label,local_60,false);
    pLVar22 = this;
    local_40 = pLVar13;
    pOVar20 = LoadLibraryValueOpnd(this,newObjInstr,ValueArrayConstructor);
    InsertCompareBranch(pLVar22,(Opnd *)pLVar23,pOVar20,BrEq_A,true,pLVar13,newObjInstr,false);
    local_34 = (uint)newObjInstr->m_opcode;
    pOVar20 = IR::Instr::UnlinkDst(newObjInstr);
    local_78 = pLVar23;
    pOVar14 = IR::Instr::UnlinkSrc1(newObjInstr);
    src2Opnd = IR::Instr::UnlinkSrc2(newObjInstr);
    instr = IR::ProfiledInstr::New((OpCode)local_34,pOVar20,pOVar14,src2Opnd,pFVar3);
    pPVar10 = IR::Instr::AsProfiledInstr(newObjInstr);
    (instr->u).profileId = (pPVar10->u).profileId;
    IR::Instr::InsertAfter(newObjInstr,&instr->super_Instr);
    newObjInstr->m_opcode = BailOut;
    GenerateBailOut(this,newObjInstr,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
    IR::Instr::InsertBefore(&instr->super_Instr,&local_40->super_Instr);
    pLVar23 = local_78;
  }
  if ((instr->super_Instr).m_kind != InstrKindProfiled) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1480,"(newObjInstr->IsProfiledInstr())","newObjInstr->IsProfiledInstr()");
    if (!bVar4) goto LAB_005482df;
    *puVar9 = 0;
  }
  baseOpnd = IR::Opnd::AsRegOpnd((instr->super_Instr).m_dst);
  pLVar22 = (Lowerer *)(instr->super_Instr).m_next;
  pPVar10 = IR::Instr::AsProfiledInstr(&instr->super_Instr);
  pFVar3 = local_60;
  TVar1 = (pPVar10->u).field_3.fldInfoData;
  local_34 = (uint)TVar1 & 0xffff;
  local_40 = (LabelInstr *)0x0;
  local_70 = (ArrayCallSiteInfo *)0x0;
  iVar21 = 0;
  local_78 = pLVar23;
  if (TVar1.f1 != 0xffff) {
    pJVar11 = Func::GetReadOnlyProfileInfo(local_60);
    index = (ProfileId)local_34;
    pAVar12 = JITTimeProfileInfo::GetArrayCallSiteInfo(pJVar11,index);
    pJVar11 = Func::GetReadOnlyProfileInfo(pFVar3);
    local_40 = (LabelInstr *)JITTimeProfileInfo::GetArrayCallSiteInfoAddr(pJVar11,index);
    local_70 = pAVar12;
    if (pAVar12 == (ArrayCallSiteInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x148c,"(arrayInfo)","arrayInfo");
      if (!bVar4) goto LAB_005482df;
      *puVar9 = 0;
    }
    iVar21 = Func::GetWeakFuncRef(local_60);
    if (iVar21 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x148e,"(weakFuncRef)","weakFuncRef");
      if (!bVar4) goto LAB_005482df;
      *puVar9 = 0;
      iVar21 = 0;
    }
  }
  pFVar3 = local_60;
  local_58 = iVar21;
  local_68 = IR::LabelInstr::New(Label,local_60,true);
  local_50 = IR::LabelInstr::New(Label,pFVar3,false);
  pOVar20 = (instr->super_Instr).m_src2;
  bVar4 = IR::Opnd::IsSymOpnd(pOVar20);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1495,"(linkOpnd->IsSymOpnd())","linkOpnd->IsSymOpnd()");
    if (!bVar4) goto LAB_005482df;
    *puVar9 = 0;
  }
  local_48 = this;
  pSVar15 = IR::Opnd::AsSymOpnd(pOVar20);
  pSVar16 = Sym::AsStackSym(pSVar15->m_sym);
  pIVar8 = (pSVar16->field_5).m_instrDef;
  if ((pSVar16->field_0x18 & pIVar8 != (Instr *)0x0) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1497,"(linkSym->IsSingleDef())","linkSym->IsSingleDef()");
    if (!bVar4) goto LAB_005482df;
    *puVar9 = 0;
    if ((pSVar16->field_0x18 & 1) == 0) {
      pIVar8 = (Instr *)0x0;
    }
    else {
      pIVar8 = (pSVar16->field_5).m_instrDef;
    }
  }
  pOVar20 = pIVar8->m_src1;
  local_7a = (pOVar20->m_valueType).field_0;
  bVar4 = ValueType::IsLikelyInt((ValueType *)&local_7a.field_0);
  if ((!bVar4) ||
     (((bVar4 = IR::Opnd::IsAddrOpnd(pOVar20), !bVar4 &&
       (bVar4 = IR::Opnd::IsRegOpnd(pOVar20), !bVar4)) ||
      (AVar5 = StackSym::GetArgSlotNum(pSVar16), AVar5 != 2)))) goto LAB_00548187;
  bVar4 = StackSym::IsArgSlotSym(pSVar16);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x14a3,"(linkSym->IsArgSlotSym())","Not an argSlot symbol...");
    if (!bVar4) goto LAB_005482df;
    *puVar9 = 0;
  }
  pOVar14 = pIVar8->m_src2;
  bVar4 = IR::Opnd::IsRegOpnd(pOVar20);
  if (!bVar4) {
    length = StackSym::GetIntConstValue(pSVar16);
    if (8 < length) goto LAB_00548187;
    bVar4 = GenerateProfiledNewScObjArrayFastPath
                      (local_48,&instr->super_Instr,local_70,(intptr_t)local_40,local_58,length,
                       local_50,false);
    goto LAB_0054808b;
  }
  pRVar17 = IR::Opnd::AsRegOpnd(pOVar20);
  bVar4 = IR::Opnd::IsNotInt(&pRVar17->super_Opnd);
  pAVar12 = local_70;
  if (bVar4) goto LAB_00548187;
  if (local_70 == (ArrayCallSiteInfo *)0x0) {
LAB_00548063:
    bVar4 = GenerateProfiledNewScObjArrayFastPath<Js::JavascriptArray>
                      (local_48,&instr->super_Instr,pAVar12,(intptr_t)local_40,local_58,local_68,
                       local_50,pOVar20,0,0);
  }
  else {
    bVar4 = Js::ArrayCallSiteInfo::IsNativeIntArray(local_70);
    if (bVar4) {
      bVar4 = GenerateProfiledNewScObjArrayFastPath<Js::JavascriptNativeIntArray>
                        (local_48,&instr->super_Instr,pAVar12,(intptr_t)local_40,local_58,local_68,
                         local_50,pOVar20,0x1a,0x38);
    }
    else {
      bVar4 = Js::ArrayCallSiteInfo::IsNativeFloatArray(pAVar12);
      if (!bVar4) goto LAB_00548063;
      bVar4 = GenerateProfiledNewScObjArrayFastPath<Js::JavascriptNativeFloatArray>
                        (local_48,&instr->super_Instr,pAVar12,(intptr_t)local_40,local_58,local_68,
                         local_50,pOVar20,0x1a,0x38);
    }
  }
LAB_0054808b:
  if (bVar4 != false) {
    pRVar17 = IR::Opnd::AsRegOpnd(pOVar14);
    pSVar16 = Sym::AsStackSym(&pRVar17->m_sym->super_Sym);
    bVar4 = StackSym::IsArgSlotSym(pSVar16);
    if ((bVar4) || ((pSVar16->field_0x18 & 1) == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x14cc,"(!linkSym->IsArgSlotSym() && linkSym->m_isSingleDef)",
                         "Arg tree not single def...");
      if (!bVar4) goto LAB_005482df;
      *puVar9 = 0;
    }
    this_00 = (pSVar16->field_5).m_instrDef;
    uVar7 = IR::Instr::GetArgOutCount(this_00,false);
    if (uVar7 != 2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x14cf,"(startCallInstr->GetArgOutCount(false) == 2)",
                         "Generating ArrayFastPath for more than 1 parameter not allowed.");
      if (!bVar4) {
LAB_005482df:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar9 = 0;
    }
    IR::Instr::Move(this_00,&instr->super_Instr);
    IR::Instr::Move(pIVar8,&instr->super_Instr);
  }
LAB_00548187:
  IR::Instr::UnlinkSrc1(&instr->super_Instr);
  pFVar3 = local_60;
  pAVar18 = IR::AddrOpnd::New((intptr_t)local_40,AddrOpndKindDynamicArrayCallSiteInfo,local_60,false
                              ,(Var)0x0);
  pLVar23 = local_48;
  LowererMD::LoadNewScObjFirstArg(&local_48->m_lowererMD,&instr->super_Instr,&pAVar18->super_Opnd,0)
  ;
  newSrc = IR::HelperCallOpnd::New(HelperScrArr_ProfiledNewInstance,pFVar3);
  IR::Instr::SetSrc1(&instr->super_Instr,&newSrc->super_Opnd);
  GenerateDirectCall(pLVar23,&instr->super_Instr,(Opnd *)local_78,1);
  pIVar19 = IR::IndirOpnd::New(baseOpnd,0,TyUint64,pFVar3,false);
  pOVar20 = LoadVTableValueOpnd(pLVar23,(Instr *)pLVar22,VtableJavascriptArray);
  pLVar13 = local_50;
  branchInstr = InsertCompareBranch(pLVar23,&pIVar19->super_Opnd,pOVar20,BrEq_A,true,local_50,
                                    (Instr *)pLVar22,false);
  LowererMD::InsertObjectPoison(&baseOpnd->super_Opnd,branchInstr,(Instr *)pLVar22,true);
  pIVar19 = IR::IndirOpnd::New(baseOpnd,0x1a,TyUint16,pFVar3,false);
  src = IR::Opnd::CreateProfileIdOpnd((ProfileId)local_34,pFVar3);
  InsertMove(&pIVar19->super_Opnd,&src->super_Opnd,(Instr *)pLVar22,true);
  pIVar19 = IR::IndirOpnd::New(baseOpnd,0x38,TyInt64,pFVar3,false);
  pAVar18 = IR::AddrOpnd::New(local_58,AddrOpndKindDynamicFunctionBodyWeakRef,pFVar3,false,(Var)0x0)
  ;
  InsertMove(&pIVar19->super_Opnd,&pAVar18->super_Opnd,(Instr *)pLVar22,true);
  IR::Instr::InsertBefore((Instr *)pLVar22,&pLVar13->super_Instr);
  pIVar8 = RemoveLoweredRegionStartMarker(pLVar22,local_88);
  return pIVar8;
}

Assistant:

IR::Instr *
Lowerer::LowerNewScObjArray(IR::Instr *newObjInstr)
{
    if (newObjInstr->HasEmptyArgOutChain())
    {
        newObjInstr->FreeSrc2();
        return LowerNewScObjArrayNoArg(newObjInstr);
    }

    IR::Instr* startMarkerInstr = nullptr;

    IR::Opnd *targetOpnd = newObjInstr->GetSrc1();
    Func *func = newObjInstr->m_func;

    if (!targetOpnd->IsAddrOpnd())
    {
        if (!newObjInstr->HasBailOutInfo() || newObjInstr->OnlyHasLazyBailOut())
        {
            return this->LowerNewScObject(newObjInstr, true, true);
        }

        // Insert a temporary label before the instruction we're about to lower, so that we can return
        // the first instruction above that needs to be lowered after we're done - regardless of argument
        // list, StartCall, etc.
        startMarkerInstr = InsertLoweredRegionStartMarker(newObjInstr);

        // For whatever reason, we couldn't do a fixed function check on the call target.
        // Generate a runtime check on the target.
        Assert(
            newObjInstr->GetBailOutKind() == IR::BailOutOnNotNativeArray ||
            newObjInstr->GetBailOutKind() == BailOutInfo::WithLazyBailOut(IR::BailOutOnNotNativeArray)
        );
        IR::LabelInstr *labelSkipBailOut = IR::LabelInstr::New(Js::OpCode::Label, func);
        InsertCompareBranch(
            targetOpnd,
            LoadLibraryValueOpnd(newObjInstr, LibraryValue::ValueArrayConstructor),
            Js::OpCode::BrEq_A,
            true,
            labelSkipBailOut,
            newObjInstr);

        IR::ProfiledInstr *instrNew = IR::ProfiledInstr::New(newObjInstr->m_opcode, newObjInstr->UnlinkDst(), newObjInstr->UnlinkSrc1(), newObjInstr->UnlinkSrc2(), func);
        instrNew->u.profileId = newObjInstr->AsProfiledInstr()->u.profileId;
        newObjInstr->InsertAfter(instrNew);
        newObjInstr->m_opcode = Js::OpCode::BailOut;
        GenerateBailOut(newObjInstr);

        instrNew->InsertBefore(labelSkipBailOut);
        newObjInstr = instrNew;
    }
    else
    {
        // Insert a temporary label before the instruction we're about to lower, so that we can return
        // the first instruction above that needs to be lowered after we're done - regardless of argument
        // list, StartCall, etc.
        startMarkerInstr = InsertLoweredRegionStartMarker(newObjInstr);
    }

    intptr_t weakFuncRef = 0;
    Js::ArrayCallSiteInfo *arrayInfo = nullptr;
    intptr_t arrayInfoAddr = 0;
    Assert(newObjInstr->IsProfiledInstr());

    IR::RegOpnd *resultObjOpnd = newObjInstr->GetDst()->AsRegOpnd();
    IR::Instr * insertInstr = newObjInstr->m_next;

    Js::ProfileId profileId = static_cast<Js::ProfileId>(newObjInstr->AsProfiledInstr()->u.profileId);

    // We may not have profileId if we converted a NewScObject to NewScObjArray
    if (profileId != Js::Constants::NoProfileId)
    {
        arrayInfo = func->GetReadOnlyProfileInfo()->GetArrayCallSiteInfo(profileId);
        arrayInfoAddr = func->GetReadOnlyProfileInfo()->GetArrayCallSiteInfoAddr(profileId);
        Assert(arrayInfo);
        weakFuncRef = func->GetWeakFuncRef();
        Assert(weakFuncRef);
    }

    IR::LabelInstr * helperLabel = IR::LabelInstr::New(Js::OpCode::Label, func, true);
    IR::LabelInstr *labelDone = IR::LabelInstr::New(Js::OpCode::Label, func);
    IR::Opnd *linkOpnd = newObjInstr->GetSrc2();

    Assert(linkOpnd->IsSymOpnd());
    StackSym *linkSym = linkOpnd->AsSymOpnd()->m_sym->AsStackSym();
    Assert(linkSym->IsSingleDef());
    IR::Instr* argInstr = linkSym->GetInstrDef();
    IR::Opnd *opndOfArrayCtor = argInstr->GetSrc1();
    const uint16 upperBoundValue = 8;
    // Generate fast path only if it meets all the conditions:
    // 1. It is the only parameter and it is a likely int
    // 2a. If 1st parameter is a variable, emit fast path with checks
    // 2b. If 1st parameter is a constant, it is in range 0 and upperBoundValue (inclusive)
    if (opndOfArrayCtor->GetValueType().IsLikelyInt() && (opndOfArrayCtor->IsAddrOpnd() || opndOfArrayCtor->IsRegOpnd())) // #1
    {
        if ((linkSym->GetArgSlotNum() == 2)) // 1. It is the only parameter
        {
            AssertMsg(linkSym->IsArgSlotSym(), "Not an argSlot symbol...");
            linkOpnd = argInstr->GetSrc2();

            bool emittedFastPath = false;
            // 2a. If 1st parameter is a variable, emit fast path with checks
            if (opndOfArrayCtor->IsRegOpnd())
            {
                if (!opndOfArrayCtor->AsRegOpnd()->IsNotInt())
                {
                    // 3. GenerateFastPath
                    if (arrayInfo && arrayInfo->IsNativeIntArray())
                    {
                        emittedFastPath = GenerateProfiledNewScObjArrayFastPath<Js::JavascriptNativeIntArray>(newObjInstr, arrayInfo, arrayInfoAddr, weakFuncRef, helperLabel, labelDone, opndOfArrayCtor,
                                                                Js::JavascriptNativeIntArray::GetOffsetOfArrayCallSiteIndex(),
                                                                Js::JavascriptNativeIntArray::GetOffsetOfWeakFuncRef());
                    }
                    else if (arrayInfo && arrayInfo->IsNativeFloatArray())
                    {
                        emittedFastPath = GenerateProfiledNewScObjArrayFastPath<Js::JavascriptNativeFloatArray>(newObjInstr, arrayInfo, arrayInfoAddr, weakFuncRef, helperLabel, labelDone, opndOfArrayCtor,
                                                                  Js::JavascriptNativeFloatArray::GetOffsetOfArrayCallSiteIndex(),
                                                                  Js::JavascriptNativeFloatArray::GetOffsetOfWeakFuncRef());
                    }
                    else
                    {
                        emittedFastPath = GenerateProfiledNewScObjArrayFastPath<Js::JavascriptArray>(newObjInstr, arrayInfo, arrayInfoAddr, weakFuncRef, helperLabel, labelDone, opndOfArrayCtor, 0, 0);
                    }
                }
            }
            // 2b. If 1st parameter is a constant, it is in range 0 and upperBoundValue (inclusive)
            else
            {
                int32 length = linkSym->GetIntConstValue();
                if (length >= 0 && length <= upperBoundValue)
                {
                    emittedFastPath = GenerateProfiledNewScObjArrayFastPath(newObjInstr, arrayInfo, arrayInfoAddr, weakFuncRef, (uint32)length, labelDone, false);
                }
            }
            // Since we emitted fast path above, move the startCall/argOut instruction right before helper
            if (emittedFastPath)
            {
                linkSym = linkOpnd->AsRegOpnd()->m_sym->AsStackSym();
                AssertMsg(!linkSym->IsArgSlotSym() && linkSym->m_isSingleDef, "Arg tree not single def...");

                IR::Instr* startCallInstr = linkSym->m_instrDef;
                AssertMsg(startCallInstr->GetArgOutCount(false) == 2, "Generating ArrayFastPath for more than 1 parameter not allowed.");

                // Since we emitted fast path above, move the startCall/argOut instruction right before helper
                startCallInstr->Move(newObjInstr);
                argInstr->Move(newObjInstr);
            }
        }
    }
    newObjInstr->UnlinkSrc1();

    IR::Opnd *profileOpnd = IR::AddrOpnd::New(arrayInfoAddr, IR::AddrOpndKindDynamicArrayCallSiteInfo, func);
    this->m_lowererMD.LoadNewScObjFirstArg(newObjInstr, profileOpnd);

    IR::JnHelperMethod helperMethod = IR::HelperScrArr_ProfiledNewInstance;

    newObjInstr->SetSrc1(IR::HelperCallOpnd::New(helperMethod, func));
    newObjInstr = GenerateDirectCall(newObjInstr, targetOpnd, Js::CallFlags_New);

    IR::BranchInstr* branchInstr = InsertCompareBranch(
        IR::IndirOpnd::New(resultObjOpnd, 0, TyMachPtr, func),
        LoadVTableValueOpnd(insertInstr, VTableValue::VtableJavascriptArray),
        Js::OpCode::BrEq_A,
        true,
        labelDone,
        insertInstr);

    InsertObjectPoison(resultObjOpnd, branchInstr, insertInstr, true);
    // We know we have a native array, so store the weak ref and call site index.
    InsertMove(
        IR::IndirOpnd::New(resultObjOpnd, Js::JavascriptNativeArray::GetOffsetOfArrayCallSiteIndex(), TyUint16, func),
        IR::Opnd::CreateProfileIdOpnd(profileId, func),
        insertInstr);
    InsertMove(
        IR::IndirOpnd::New(resultObjOpnd, Js::JavascriptNativeArray::GetOffsetOfWeakFuncRef(), TyMachReg, func),
        IR::AddrOpnd::New(weakFuncRef, IR::AddrOpndKindDynamicFunctionBodyWeakRef, func),
        insertInstr);
    insertInstr->InsertBefore(labelDone);

    return RemoveLoweredRegionStartMarker(startMarkerInstr);
}